

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  undefined1 local_1c [4];
  FILE *pFStack_18;
  int testdata;
  FILE *fin;
  char *Filename;
  
  fin = (FILE *)anon_var_dwarf_73d;
  poVar1 = std::operator<<((ostream *)&std::cout,"Input file:");
  poVar1 = std::operator<<(poVar1,(char *)fin);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pFStack_18 = fopen((char *)fin,"r");
  LefDefParser::lefrSetMacroCbk(test);
  LefDefParser::lefrSetPinCbk(PinCBK);
  LefDefParser::lefrRead(pFStack_18,(char *)fin,local_1c);
  fclose(pFStack_18);
  return 0;
}

Assistant:

int main(){
    const char *Filename = "input1.lef";
    std::cout << "Input file:" << Filename << std::endl;
    FILE *fin = fopen(Filename, "r");
    int testdata;
    lefrSetMacroCbk(test);
    lefrSetPinCbk(PinCBK);
    lefrRead(fin, Filename, &testdata);
    fclose(fin);
}